

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O0

void __thiscall database::Container::_PrepareContainer(Container *this)

{
  pointer pCVar1;
  size_t sVar2;
  pointer pCVar3;
  vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>
  *this_00;
  undefined1 local_40 [8];
  vector<database::ComparableString,_std::allocator<database::ComparableString>_> vector;
  size_t i;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_11;
  Container *pCStack_10;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> s_hash;
  Container *this_local;
  
  pCStack_10 = this;
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_11,&this->m_name);
  this->m_id = sVar2;
  std::
  make_unique<std::vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>>
            ();
  std::
  unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
  ::operator=(&this->m_data,
              (unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
               *)&i);
  std::
  unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                 *)&i);
  vector.super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pCVar1 = vector.
             super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pCVar3 = (pointer)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
                      ::size(&this->m_schema);
    if (pCVar3 <= pCVar1) break;
    std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::vector
              ((vector<database::ComparableString,_std::allocator<database::ComparableString>_> *)
               local_40);
    this_00 = (vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>
               *)std::
                 unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                 ::operator->(&this->m_data);
    std::
    vector<std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::allocator<std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>
    ::
    emplace_back<std::vector<database::ComparableString,std::allocator<database::ComparableString>>&>
              (this_00,(vector<database::ComparableString,_std::allocator<database::ComparableString>_>
                        *)local_40);
    std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>::~vector
              ((vector<database::ComparableString,_std::allocator<database::ComparableString>_> *)
               local_40);
    vector.
    super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)&((vector.
                     super__Vector_base<database::ComparableString,_std::allocator<database::ComparableString>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_string).field_0x1;
  }
  return;
}

Assistant:

void database::Container::_PrepareContainer()
{
  std::hash<std::string> s_hash;
  m_id = s_hash(m_name);
  m_data = std::make_unique<database::impl_storage_type>();
  for(size_t i = 0; i < m_schema.size(); i += 1)
  {
    std::vector<database::ComparableString> vector;
    m_data -> emplace_back(vector);
  }
}